

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix
          (SquareMatrix<float> *this,SquareMatrix<float> *matrix)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = matrix->size_;
  this->size_ = lVar3;
  if (lVar3 != 0) {
    uVar4 = lVar3 * lVar3;
    lVar3 = 0;
    pfVar2 = (float *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
    (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
    pfVar1 = (matrix->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    do {
      pfVar2[lVar3] = pfVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (uVar4 + (uVar4 == 0) != lVar3);
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
}

Assistant:

inline int64_t rows() const { return size_ ; }